

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall IteratorTest::arithmeticOperatorsTest<false>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long *puVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar6;
  runtime_error *prVar7;
  logic_error *plVar8;
  code *pcVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined *puVar13;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_238;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_200;
  undefined1 local_1d0 [16];
  size_t *local_1c0;
  size_t local_1a8;
  size_t local_1a0;
  unsigned_long *local_190;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_188;
  view_pointer local_158;
  int *piStack_150;
  ulong local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  view_pointer local_128;
  int *piStack_120;
  ulong local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  view_pointer local_f8;
  int *piStack_f0;
  ulong local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  view_pointer local_c8;
  int *piStack_c0;
  ulong local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_90;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_60;
  
  _Var4._M_current = (unsigned_long *)operator_new(8);
  *_Var4._M_current = 0x18;
  local_1d0._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_238);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.index_ = 0;
  local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.view_ = (view_pointer)0x0;
  local_238.pointer_ = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_238);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_200,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
  local_238.index_ = local_200.index_;
  local_238.view_ = local_200.view_;
  local_238.pointer_ = local_200.pointer_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_238.coordinates_,&local_200.coordinates_);
  if (local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar11 = 0;
  do {
    if ((local_238.view_ == (view_pointer)0x0) ||
       (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      pcVar9 = std::runtime_error::~runtime_error;
      puVar13 = &std::runtime_error::typeinfo;
LAB_001c14f5:
      __cxa_throw(plVar8,puVar13,pcVar9);
    }
    if (*local_238.pointer_ != this->data_[lVar11]) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001c14f5;
    }
    local_200.view_ = (view_pointer)0x1;
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator+=
              (&local_238,(difference_type *)&local_200);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_200,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,local_1a0);
  if (local_238.view_ == (view_pointer)0x0) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  else {
    if (local_200.view_ == local_238.view_) {
      if (local_238.index_ == local_200.index_) {
        if (local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar5 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                           (&local_238);
        if ((pIVar5->view_ == (view_pointer)0x0) ||
           ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          pcVar9 = std::runtime_error::~runtime_error;
          puVar13 = &std::runtime_error::typeinfo;
LAB_001c1ca7:
          __cxa_throw(plVar8,puVar13,pcVar9);
        }
        if (*pIVar5->pointer_ != 0x2e) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar13 = &std::logic_error::typeinfo;
          goto LAB_001c1ca7;
        }
        if (local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_1c0,local_1a8 * 0x18);
        operator_delete(_Var4._M_current,8);
        _Var4._M_current = (unsigned_long *)operator_new(8);
        *_Var4._M_current = 0x18;
        local_1d0._0_8_ = this;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var4,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_238);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_238.index_ = 0;
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.view_ = (view_pointer)0x0;
        local_238.pointer_ = (pointer)0x0;
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_238);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_200,
                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0,0);
        puVar2 = local_238.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar1 = local_238.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_238.view_ = local_200.view_;
        local_238.pointer_ = local_200.pointer_;
        local_238.index_ = local_200.index_;
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_200.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_200.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_238.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_200.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1,(long)puVar2 - (long)puVar1);
        }
        if (local_200.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar11 = 0;
        do {
          if ((local_238.view_ == (view_pointer)0x0) ||
             (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
            pcVar9 = std::runtime_error::~runtime_error;
            puVar13 = &std::runtime_error::typeinfo;
LAB_001c1527:
            __cxa_throw(plVar8,puVar13,pcVar9);
          }
          if (*local_238.pointer_ != this->data_[lVar11]) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001c1527;
          }
          local_200.view_ = (view_pointer)0x1;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_238,
                     (difference_type *)&local_200);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x18);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_200,
                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0,local_1a0);
        if (local_238.view_ == (view_pointer)0x0) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
        }
        else {
          if (local_200.view_ == local_238.view_) {
            if (local_238.index_ == local_200.index_) {
              if (local_200.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_238)
              ;
              if ((pIVar6->view_ == (view_pointer)0x0) ||
                 ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                pcVar9 = std::runtime_error::~runtime_error;
                puVar13 = &std::runtime_error::typeinfo;
LAB_001c1d55:
                __cxa_throw(plVar8,puVar13,pcVar9);
              }
              if (*pIVar6->pointer_ != 0x2e) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar9 = std::logic_error::~logic_error;
                puVar13 = &std::logic_error::typeinfo;
                goto LAB_001c1d55;
              }
              if (local_238.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_1c0,local_1a8 * 0x18);
              operator_delete(_Var4._M_current,8);
              _Var4._M_current = (unsigned_long *)operator_new(8);
              *_Var4._M_current = 0x18;
              local_1d0._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var4,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_238);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_238.index_ = 0;
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_238.view_ = (view_pointer)0x0;
              local_238.pointer_ = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_238);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_188,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0)
              ;
              local_200.view_ = local_188.view_;
              local_200.pointer_ = local_188.pointer_;
              local_200.index_ = local_188.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_200.coordinates_,&local_188.coordinates_);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_200);
              puVar2 = local_238.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              puVar1 = local_238.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_238.view_ = local_200.view_;
              local_238.pointer_ = local_200.pointer_;
              local_238.index_ = local_200.index_;
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_200.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_200.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_200.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_200.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_200.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_200.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar1 != (pointer)0x0) {
                operator_delete(puVar1,(long)puVar2 - (long)puVar1);
              }
              if (local_200.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar11 = 0;
              do {
                if ((local_238.view_ == (view_pointer)0x0) ||
                   (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c1559:
                  __cxa_throw(plVar8,puVar13,pcVar9);
                }
                if (*local_238.pointer_ != this->data_[lVar11]) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001c1559;
                }
                local_200.view_ = (view_pointer)0x1;
                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                          ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_238,
                           (difference_type *)&local_200);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_200,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,
                         local_1a0);
              if (local_238.view_ == (view_pointer)0x0) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              else {
                if (local_200.view_ == local_238.view_) {
                  if (local_238.index_ == local_200.index_) {
                    if (local_200.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                        &local_238);
                    if ((pIVar6->view_ == (view_pointer)0x0) ||
                       ((pIVar6->view_->geometry_).size_ <= pIVar6->index_)) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                      pcVar9 = std::runtime_error::~runtime_error;
                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c1e03:
                      __cxa_throw(plVar8,puVar13,pcVar9);
                    }
                    if (*pIVar6->pointer_ != 0x2e) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar8,"test failed.");
                      pcVar9 = std::logic_error::~logic_error;
                      puVar13 = &std::logic_error::typeinfo;
                      goto LAB_001c1e03;
                    }
                    if (local_238.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_1c0,local_1a8 * 0x18);
                    operator_delete(_Var4._M_current,8);
                    _Var4._M_current = (unsigned_long *)operator_new(8);
                    *_Var4._M_current = 0x18;
                    local_1d0._0_8_ = this;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),_Var4,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_238);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
                    local_238.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_238.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_238.index_ = 0;
                    local_238.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_238.view_ = (view_pointer)0x0;
                    local_238.pointer_ = (pointer)0x0;
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              (&local_238);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_200,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,
                               local_1a0);
                    local_238.index_ = local_200.index_;
                    local_238.view_ = local_200.view_;
                    local_238.pointer_ = local_200.pointer_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              (&local_238.coordinates_,&local_200.coordinates_);
                    if (local_200.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_200.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar12 = 0x17;
                    do {
                      local_200.view_ = (view_pointer)0x1;
                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator-=
                                (&local_238,(difference_type *)&local_200);
                      if ((local_238.view_ == (view_pointer)0x0) ||
                         (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar8,"Assertion failed.");
                        pcVar9 = std::runtime_error::~runtime_error;
                        puVar13 = &std::runtime_error::typeinfo;
LAB_001c158b:
                        __cxa_throw(plVar8,puVar13,pcVar9);
                      }
                      iVar10 = (int)uVar12;
                      if (*local_238.pointer_ != this->data_[uVar12]) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar8,"test failed.");
                        pcVar9 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001c158b;
                      }
                      uVar12 = (ulong)(iVar10 - 1);
                    } while (iVar10 != 0);
                    andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0);
                    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                              (&local_200,
                               (View<int,_false,_std::allocator<unsigned_long>_> *)local_1d0,0);
                    if (local_238.view_ == (view_pointer)0x0) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                    }
                    else {
                      if (local_200.view_ == local_238.view_) {
                        if (local_238.index_ == local_200.index_) {
                          if (local_200.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_200.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((local_238.view_ == (view_pointer)0x0) ||
                             (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                            pcVar9 = std::runtime_error::~runtime_error;
                            puVar13 = &std::runtime_error::typeinfo;
LAB_001c1eb1:
                            __cxa_throw(plVar8,puVar13,pcVar9);
                          }
                          if (*local_238.pointer_ != 0) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar9 = std::logic_error::~logic_error;
                            puVar13 = &std::logic_error::typeinfo;
                            goto LAB_001c1eb1;
                          }
                          if (local_238.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_238.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_1c0,local_1a8 * 0x18);
                          operator_delete(_Var4._M_current,8);
                          _Var4._M_current = (unsigned_long *)operator_new(8);
                          *_Var4._M_current = 0x18;
                          local_1d0._0_8_ = this;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_1d0 + 8),
                                     _Var4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )(_Var4._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_238);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_238.index_ = 0;
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_238.view_ = (view_pointer)0x0;
                          local_238.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                     &local_238);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                     &local_200,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0,
                                     local_1a0);
                          puVar2 = local_238.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          puVar1 = local_238.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_238.view_ = local_200.view_;
                          local_238.pointer_ = local_200.pointer_;
                          local_238.index_ = local_200.index_;
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               local_200.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_200.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          local_238.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage =
                               local_200.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_200.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          if (puVar1 != (pointer)0x0) {
                            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                          }
                          if (local_200.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_200.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          uVar12 = 0x17;
                          do {
                            local_200.view_ = (view_pointer)0x1;
                            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
                                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                       &local_238,(difference_type *)&local_200);
                            if ((local_238.view_ == (view_pointer)0x0) ||
                               (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar8,"Assertion failed.");
                              pcVar9 = std::runtime_error::~runtime_error;
                              puVar13 = &std::runtime_error::typeinfo;
LAB_001c15bd:
                              __cxa_throw(plVar8,puVar13,pcVar9);
                            }
                            iVar10 = (int)uVar12;
                            if (*local_238.pointer_ != this->data_[uVar12]) {
                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar8,"test failed.");
                              pcVar9 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001c15bd;
                            }
                            uVar12 = (ulong)(iVar10 - 1);
                          } while (iVar10 != 0);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                     &local_200,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_1d0,0)
                          ;
                          if (local_238.view_ == (view_pointer)0x0) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                          }
                          else {
                            if (local_200.view_ == local_238.view_) {
                              if (local_238.index_ == local_200.index_) {
                                if (local_200.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                if ((local_238.view_ == (view_pointer)0x0) ||
                                   (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar8,"Assertion failed.");
                                  pcVar9 = std::runtime_error::~runtime_error;
                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c1f5f:
                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                }
                                if (*local_238.pointer_ != 0) {
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar8,"test failed.");
                                  pcVar9 = std::logic_error::~logic_error;
                                  puVar13 = &std::logic_error::typeinfo;
                                  goto LAB_001c1f5f;
                                }
                                if (local_238.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_1c0,local_1a8 * 0x18);
                                operator_delete(_Var4._M_current,8);
                                _Var4._M_current = (unsigned_long *)operator_new(8);
                                *_Var4._M_current = 0x18;
                                local_1d0._0_8_ = this;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)
                                           (local_1d0 + 8),_Var4,
                                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )(_Var4._M_current + 1),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_238);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1d0);
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_238.index_ = 0;
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_238.view_ = (view_pointer)0x0;
                                local_238.pointer_ = (pointer)0x0;
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *
                                              )&local_238);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1d0);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_188,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1d0,local_1a0);
                                local_200.view_ = local_188.view_;
                                local_200.pointer_ = local_188.pointer_;
                                local_200.index_ = local_188.index_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          (&local_200.coordinates_,&local_188.coordinates_);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_> *
                                              )&local_200);
                                puVar2 = local_238.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                puVar1 = local_238.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                local_238.view_ = local_200.view_;
                                local_238.pointer_ = local_200.pointer_;
                                local_238.index_ = local_200.index_;
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     local_200.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_200.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                                local_238.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     local_200.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_200.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                if (puVar1 != (pointer)0x0) {
                                  operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                }
                                if (local_200.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                if (local_188.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_188.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                uVar12 = 0x17;
                                do {
                                  local_200.view_ = (view_pointer)0x1;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  operator-=((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                             &local_238,(difference_type *)&local_200);
                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                     (((local_238.view_)->geometry_).size_ <= local_238.index_)) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                    pcVar9 = std::runtime_error::~runtime_error;
                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c15ef:
                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                  }
                                  iVar10 = (int)uVar12;
                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar8,"test failed.");
                                    pcVar9 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001c15ef;
                                  }
                                  uVar12 = (ulong)(iVar10 - 1);
                                } while (iVar10 != 0);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1d0);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_200,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1d0,0);
                                if (local_238.view_ == (view_pointer)0x0) {
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar8,"Assertion failed.");
                                }
                                else {
                                  if (local_200.view_ == local_238.view_) {
                                    if (local_238.index_ == local_200.index_) {
                                      if (local_200.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      if ((local_238.view_ == (view_pointer)0x0) ||
                                         (((local_238.view_)->geometry_).size_ <= local_238.index_))
                                      {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
                                        pcVar9 = std::runtime_error::~runtime_error;
                                        puVar13 = &std::runtime_error::typeinfo;
LAB_001c200d:
                                        __cxa_throw(plVar8,puVar13,pcVar9);
                                      }
                                      if (*local_238.pointer_ != 0) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        pcVar9 = std::logic_error::~logic_error;
                                        puVar13 = &std::logic_error::typeinfo;
                                        goto LAB_001c200d;
                                      }
                                      if (local_238.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      operator_delete(local_1c0,local_1a8 * 0x18);
                                      operator_delete(_Var4._M_current,8);
                                      _Var4._M_current = (unsigned_long *)operator_new(8);
                                      *_Var4._M_current = 0x18;
                                      local_1d0._0_8_ = this;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_1d0 + 8),_Var4,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_238)
                                      ;
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                      local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_238.index_ = 0;
                                      local_238.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_238.view_ = (view_pointer)0x0;
                                      local_238.pointer_ = (pointer)0x0;
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_238);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_200,
                                               (View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_1d0,0);
                                      local_238.index_ = local_200.index_;
                                      local_238.view_ = local_200.view_;
                                      local_238.pointer_ = local_200.pointer_;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      operator=(&local_238.coordinates_,&local_200.coordinates_);
                                      if (local_200.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      lVar11 = 0;
                                      do {
                                        if ((local_238.view_ == (view_pointer)0x0) ||
                                           (((local_238.view_)->geometry_).size_ <= local_238.index_
                                           )) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
                                          pcVar9 = std::runtime_error::~runtime_error;
                                          puVar13 = &std::runtime_error::typeinfo;
LAB_001c1621:
                                          __cxa_throw(plVar8,puVar13,pcVar9);
                                        }
                                        if (*local_238.pointer_ != this->data_[lVar11]) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar8,"test failed.");
                                          pcVar9 = std::logic_error::~logic_error;
                                          puVar13 = &std::logic_error::typeinfo;
                                          goto LAB_001c1621;
                                        }
                                        andres::Iterator<int,_false,_std::allocator<unsigned_long>_>
                                        ::operator++(&local_238);
                                        lVar11 = lVar11 + 1;
                                      } while (lVar11 != 0x18);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_200,
                                               (View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_1d0,local_1a0);
                                      if (local_238.view_ == (view_pointer)0x0) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
                                      }
                                      else {
                                        if (local_200.view_ == local_238.view_) {
                                          if (local_238.index_ == local_200.index_) {
                                            if (local_200.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_200.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_238);
                                            if ((pIVar5->view_ == (view_pointer)0x0) ||
                                               ((pIVar5->view_->geometry_).size_ <= pIVar5->index_))
                                            {
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar8,"Assertion failed."
                                                        );
                                              pcVar9 = std::runtime_error::~runtime_error;
                                              puVar13 = &std::runtime_error::typeinfo;
LAB_001c20bb:
                                              __cxa_throw(plVar8,puVar13,pcVar9);
                                            }
                                            if (*pIVar5->pointer_ != 0x2e) {
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar8,"test failed.");
                                              pcVar9 = std::logic_error::~logic_error;
                                              puVar13 = &std::logic_error::typeinfo;
                                              goto LAB_001c20bb;
                                            }
                                            if (local_238.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_238.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            operator_delete(local_1c0,local_1a8 * 0x18);
                                            operator_delete(_Var4._M_current,8);
                                            _Var4._M_current = (unsigned_long *)operator_new(8);
                                            *_Var4._M_current = 0x18;
                                            local_1d0._0_8_ = this;
                                            andres::marray_detail::
                                            Geometry<std::allocator<unsigned_long>>::
                                            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                      ((Geometry<std::allocator<unsigned_long>> *)
                                                       (local_1d0 + 8),_Var4,
                                                       (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            local_238.index_ = 0;
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_238.view_ = (view_pointer)0x0;
                                            local_238.pointer_ = (pointer)0x0;
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                            puVar2 = local_238.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ;
                                            puVar1 = local_238.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                            local_238.view_ = local_200.view_;
                                            local_238.pointer_ = local_200.pointer_;
                                            local_238.index_ = local_200.index_;
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 local_200.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 local_200.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish;
                                            local_238.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 local_200.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                            local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_200.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            if (puVar1 != (pointer)0x0) {
                                              operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                            }
                                            if (local_200.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_200.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            lVar11 = 0;
                                            do {
                                              if ((local_238.view_ == (view_pointer)0x0) ||
                                                 (((local_238.view_)->geometry_).size_ <=
                                                  local_238.index_)) {
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar8,
                                                           "Assertion failed.");
                                                pcVar9 = std::runtime_error::~runtime_error;
                                                puVar13 = &std::runtime_error::typeinfo;
LAB_001c1653:
                                                __cxa_throw(plVar8,puVar13,pcVar9);
                                              }
                                              if (*local_238.pointer_ != this->data_[lVar11]) {
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar8,"test failed.")
                                                ;
                                                pcVar9 = std::logic_error::~logic_error;
                                                puVar13 = &std::logic_error::typeinfo;
                                                goto LAB_001c1653;
                                              }
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                              lVar11 = lVar11 + 1;
                                            } while (lVar11 != 0x18);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                            if (local_238.view_ == (view_pointer)0x0) {
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar8,"Assertion failed."
                                                        );
                                            }
                                            else {
                                              if (local_200.view_ == local_238.view_) {
                                                if (local_238.index_ == local_200.index_) {
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c2169:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*pIVar6->pointer_ != 0x2e) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c2169;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  local_200.view_ = local_188.view_;
                                                  local_200.pointer_ = local_188.pointer_;
                                                  local_200.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_200.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (((local_238.view_)->geometry_).size_ <=
                                                        local_238.index_)) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      pcVar9 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c1685:
                                                      __cxa_throw(plVar8,puVar13,pcVar9);
                                                    }
                                                    if (*local_238.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar9 = std::logic_error::~logic_error;
                                                      puVar13 = &std::logic_error::typeinfo;
                                                      goto LAB_001c1685;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c2217:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*pIVar6->pointer_ != 0x2e) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c2217;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  local_238.index_ = local_200.index_;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_238.coordinates_,
                                                              &local_200.coordinates_);
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_238);
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c16b7:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c16b7;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c22c5:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*local_238.pointer_ != 0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c22c5;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c16e9:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c16e9;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c2373:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*local_238.pointer_ != 0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c2373;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  local_200.view_ = local_188.view_;
                                                  local_200.pointer_ = local_188.pointer_;
                                                  local_200.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_200.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c171b:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c171b;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c2421:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*local_238.pointer_ != 0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c2421;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  local_238.index_ = local_200.index_;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_238.coordinates_,
                                                              &local_200.coordinates_);
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (((local_238.view_)->geometry_).size_ <=
                                                        local_238.index_)) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      pcVar9 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c174d:
                                                      __cxa_throw(plVar8,puVar13,pcVar9);
                                                    }
                                                    if (*local_238.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar9 = std::logic_error::~logic_error;
                                                      puVar13 = &std::logic_error::typeinfo;
                                                      goto LAB_001c174d;
                                                    }
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_60,&local_238,0);
                                                  if (local_60.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_60.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_60.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_60.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar5 = andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_238);
                                                  if ((pIVar5->view_ == (view_pointer)0x0) ||
                                                     ((pIVar5->view_->geometry_).size_ <=
                                                      pIVar5->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c24cf:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*pIVar5->pointer_ != 0x2e) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c24cf;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_190 = _Var4._M_current;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (((local_238.view_)->geometry_).size_ <=
                                                        local_238.index_)) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      pcVar9 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c177f:
                                                      __cxa_throw(plVar8,puVar13,pcVar9);
                                                    }
                                                    if (*local_238.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar9 = std::logic_error::~logic_error;
                                                      puVar13 = &std::logic_error::typeinfo;
                                                      goto LAB_001c177f;
                                                    }
                                                    local_b8 = local_238.index_;
                                                    local_c8 = local_238.view_;
                                                    piStack_c0 = local_238.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_b0,&local_238.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if (local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  puVar3 = local_190;
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c257d:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*pIVar6->pointer_ != 0x2e) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c257d;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(puVar3,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  local_200.view_ = local_188.view_;
                                                  local_200.pointer_ = local_188.pointer_;
                                                  local_200.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_200.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (((local_238.view_)->geometry_).size_ <=
                                                        local_238.index_)) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      pcVar9 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c17b1:
                                                      __cxa_throw(plVar8,puVar13,pcVar9);
                                                    }
                                                    if (*local_238.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar9 = std::logic_error::~logic_error;
                                                      puVar13 = &std::logic_error::typeinfo;
                                                      goto LAB_001c17b1;
                                                    }
                                                    local_e8 = local_238.index_;
                                                    local_f8 = local_238.view_;
                                                    piStack_f0 = local_238.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_e0,&local_238.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if (local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar6 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if ((pIVar6->view_ == (view_pointer)0x0) ||
                                                     ((pIVar6->view_->geometry_).size_ <=
                                                      pIVar6->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c2633:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*pIVar6->pointer_ != 0x2e) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c2633;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  local_238.index_ = local_200.index_;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::operator=(&local_238.coordinates_,
                                                              &local_200.coordinates_);
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_90,&local_238,0);
                                                  if (local_90.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_90.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_90.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_90.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c17e3:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c17e3;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c26e1:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*local_238.pointer_ != 0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c26e1;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (local_238.index_ == 0)) {
                                                      prVar7 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar7,"Assertion failed.");
                                                      __cxa_throw(prVar7,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_118 = local_238.index_;
                                                    local_128 = local_238.view_;
                                                    piStack_120 = local_238.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_110,&local_238.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if (local_110.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_110.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_110.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_110.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c1815:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c1815;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1d0);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c278f:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  if (*local_238.pointer_ != 0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c278f;
                                                  }
                                                  if (local_238.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var4._M_current = 0x18;
                                                  local_1d0._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1d0 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_238
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_238.index_ = 0;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_238.view_ = (view_pointer)0x0;
                                                  local_238.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,local_1a0);
                                                  local_200.view_ = local_188.view_;
                                                  local_200.pointer_ = local_188.pointer_;
                                                  local_200.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_200.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_200);
                                                  puVar2 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_238.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.view_ = local_200.view_;
                                                  local_238.pointer_ = local_200.pointer_;
                                                  local_238.index_ = local_200.index_;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_200.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_238.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_200.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_200.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_200.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar12 = 0x17;
                                                  do {
                                                    if ((local_238.view_ == (view_pointer)0x0) ||
                                                       (local_238.index_ == 0)) {
                                                      prVar7 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar7,"Assertion failed.");
                                                      __cxa_throw(prVar7,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_148 = local_238.index_;
                                                    local_158 = local_238.view_;
                                                    piStack_150 = local_238.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_140,&local_238.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--((
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_238);
                                                  if (local_140.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_140.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_140.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_140.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c1879:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  iVar10 = (int)uVar12;
                                                  if (*local_238.pointer_ != this->data_[uVar12]) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001c1879;
                                                  }
                                                  uVar12 = (ulong)(iVar10 - 1);
                                                  } while (iVar10 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_200,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1d0,0);
                                                  if (local_238.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_200.view_ == local_238.view_) {
                                                      if (local_238.index_ == local_200.index_) {
                                                        if (local_200.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_200.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_200.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_200.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_238.view_ == (view_pointer)0x0) ||
                                                     (((local_238.view_)->geometry_).size_ <=
                                                      local_238.index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if (*local_238.pointer_ == 0) {
                                                      if (local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_238.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_238.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_238.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1c0,local_1a8 * 0x18);
                                                  operator_delete(_Var4._M_current,8);
                                                  return;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c280b;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c280b:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c275d;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c275d:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c26af;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c26af:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c2601;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c2601:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c254b;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c254b:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c249d;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c249d:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c23ef;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c23ef:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c2341;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c2341:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c2293;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c2293:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  goto LAB_001c21e5;
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar9 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001c21e5:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                }
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar8,"test failed.")
                                                ;
                                                pcVar9 = std::logic_error::~logic_error;
                                                puVar13 = &std::logic_error::typeinfo;
                                                goto LAB_001c2137;
                                              }
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar8,"Assertion failed."
                                                        );
                                            }
                                            pcVar9 = std::runtime_error::~runtime_error;
                                            puVar13 = &std::runtime_error::typeinfo;
LAB_001c2137:
                                            __cxa_throw(plVar8,puVar13,pcVar9);
                                          }
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar8,"test failed.");
                                          pcVar9 = std::logic_error::~logic_error;
                                          puVar13 = &std::logic_error::typeinfo;
                                          goto LAB_001c2089;
                                        }
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
                                      }
                                      pcVar9 = std::runtime_error::~runtime_error;
                                      puVar13 = &std::runtime_error::typeinfo;
LAB_001c2089:
                                      __cxa_throw(plVar8,puVar13,pcVar9);
                                    }
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar8,"test failed.");
                                    pcVar9 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001c1fdb;
                                  }
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar8,"Assertion failed.");
                                }
                                pcVar9 = std::runtime_error::~runtime_error;
                                puVar13 = &std::runtime_error::typeinfo;
LAB_001c1fdb:
                                __cxa_throw(plVar8,puVar13,pcVar9);
                              }
                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar8,"test failed.");
                              pcVar9 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001c1f2d;
                            }
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                          }
                          pcVar9 = std::runtime_error::~runtime_error;
                          puVar13 = &std::runtime_error::typeinfo;
LAB_001c1f2d:
                          __cxa_throw(plVar8,puVar13,pcVar9);
                        }
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar8,"test failed.");
                        pcVar9 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001c1e7f;
                      }
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                    }
                    pcVar9 = std::runtime_error::~runtime_error;
                    puVar13 = &std::runtime_error::typeinfo;
LAB_001c1e7f:
                    __cxa_throw(plVar8,puVar13,pcVar9);
                  }
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001c1dd1;
                }
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              pcVar9 = std::runtime_error::~runtime_error;
              puVar13 = &std::runtime_error::typeinfo;
LAB_001c1dd1:
              __cxa_throw(plVar8,puVar13,pcVar9);
            }
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001c1d23;
          }
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
        }
        pcVar9 = std::runtime_error::~runtime_error;
        puVar13 = &std::runtime_error::typeinfo;
LAB_001c1d23:
        __cxa_throw(plVar8,puVar13,pcVar9);
      }
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001c1c75;
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  pcVar9 = std::runtime_error::~runtime_error;
  puVar13 = &std::runtime_error::typeinfo;
LAB_001c1c75:
  __cxa_throw(plVar8,puVar13,pcVar9);
}

Assistant:

void IteratorTest::arithmeticOperatorsTest(){
    // operator+=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();

        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
}